

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O0

bool __thiscall
cmLoadCacheCommand::ReadWithPrefix
          (cmLoadCacheCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_iterator __last;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  allocator local_1349;
  string local_1348 [39];
  allocator local_1321;
  string local_1320 [32];
  char *local_1300;
  char *begin;
  char *end;
  char *i;
  string line;
  char buffer [4096];
  long lStack_2c0;
  int bufferSize;
  ifstream fin;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  undefined4 local_9c;
  undefined1 local_98 [8];
  string e;
  string cacheFile;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmLoadCacheCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"READ_WITH_PREFIX form must specify a prefix.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,0);
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)&e.field_2 + 8)
    ;
    std::operator+(__return_storage_ptr__,pvVar3,"/CMakeCache.txt");
    bVar1 = cmsys::SystemTools::FileExists(__return_storage_ptr__);
    if (bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,2);
      std::__cxx11::string::operator=((string *)&this->Prefix,(string *)pvVar3);
      local_b0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_20);
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator+(&local_b0,3);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_20);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->VariablesToRead,local_a8,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&stack0xfffffffffffffd40,pcVar4,_S_in);
      std::__cxx11::string::string((string *)&i);
      while (bVar1 = std::ios::operator_cast_to_bool
                               ((ios *)((long)&stack0xfffffffffffffd40 +
                                       *(long *)(lStack_2c0 + -0x18))), bVar1) {
        std::istream::read((char *)&stack0xfffffffffffffd40,(long)((long)&line.field_2 + 8));
        lVar5 = std::istream::gcount();
        if (lVar5 != 0) {
          end = line.field_2._M_local_buf + 8;
          lVar5 = std::istream::gcount();
          begin = line.field_2._M_local_buf + 8 + lVar5;
          while (pcVar4 = end, end != begin) {
            local_1300 = end;
            while( true ) {
              bVar1 = false;
              if (end != begin) {
                bVar1 = *end != '\n';
              }
              if (!bVar1) break;
              end = end + 1;
            }
            if ((end == pcVar4) || (end[-1] != '\r')) {
              uVar7 = (long)end - (long)pcVar4;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1320,pcVar4,uVar7,&local_1321);
              std::__cxx11::string::operator+=((string *)&i,local_1320);
              std::__cxx11::string::~string(local_1320);
              std::allocator<char>::~allocator((allocator<char> *)&local_1321);
            }
            else {
              pcVar6 = end + ~(ulong)pcVar4;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1348,pcVar4,(ulong)pcVar6,&local_1349);
              std::__cxx11::string::operator+=((string *)&i,local_1348);
              std::__cxx11::string::~string(local_1348);
              std::allocator<char>::~allocator((allocator<char> *)&local_1349);
            }
            if (end != begin) {
              pcVar4 = (char *)std::__cxx11::string::c_str();
              CheckLine(this,pcVar4);
              std::__cxx11::string::clear();
              end = end + 1;
            }
          }
        }
      }
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        CheckLine(this,pcVar4);
      }
      this_local._7_1_ = 1;
      local_9c = 1;
      std::__cxx11::string::~string((string *)&i);
      std::ifstream::~ifstream(&stack0xfffffffffffffd40);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "Cannot load cache file from ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&e.field_2 + 8));
      cmCommand::SetError(&this->super_cmCommand,(string *)local_98);
      this_local._7_1_ = 0;
      local_9c = 1;
      std::__cxx11::string::~string((string *)local_98);
    }
    std::__cxx11::string::~string((string *)(e.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmLoadCacheCommand::ReadWithPrefix(std::vector<std::string> const& args)
{
  // Make sure we have a prefix.
  if (args.size() < 3) {
    this->SetError("READ_WITH_PREFIX form must specify a prefix.");
    return false;
  }

  // Make sure the cache file exists.
  std::string cacheFile = args[0] + "/CMakeCache.txt";
  if (!cmSystemTools::FileExists(cacheFile)) {
    std::string e = "Cannot load cache file from " + cacheFile;
    this->SetError(e);
    return false;
  }

  // Prepare the table of variables to read.
  this->Prefix = args[2];
  this->VariablesToRead.insert(args.begin() + 3, args.end());

  // Read the cache file.
  cmsys::ifstream fin(cacheFile.c_str());

  // This is a big hack read loop to overcome a buggy ifstream
  // implementation on HP-UX.  This should work on all platforms even
  // for small buffer sizes.
  const int bufferSize = 4096;
  char buffer[bufferSize];
  std::string line;
  while (fin) {
    // Read a block of the file.
    fin.read(buffer, bufferSize);
    if (fin.gcount()) {
      // Parse for newlines directly.
      const char* i = buffer;
      const char* end = buffer + fin.gcount();
      while (i != end) {
        const char* begin = i;
        while (i != end && *i != '\n') {
          ++i;
        }
        if (i == begin || *(i - 1) != '\r') {
          // Include this portion of the line.
          line += std::string(begin, i - begin);
        } else {
          // Include this portion of the line.
          // Don't include the \r in a \r\n pair.
          line += std::string(begin, i - 1 - begin);
        }
        if (i != end) {
          // Completed a line.
          this->CheckLine(line.c_str());
          line.clear();

          // Skip the newline character.
          ++i;
        }
      }
    }
  }
  if (!line.empty()) {
    // Partial last line.
    this->CheckLine(line.c_str());
  }

  return true;
}